

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

char16_t * __thiscall icu_63::number::impl::DecimalQuantity::checkHealth(DecimalQuantity *this)

{
  char *pcVar1;
  char *pcVar2;
  char16_t *pcVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar6 = this->precision;
  uVar7 = (ulong)uVar6;
  if (this->usingBytes == true) {
    if (uVar6 == 0) {
      return L"Zero precision but we are in byte mode";
    }
    iVar5 = (this->fBCD).bcdBytes.len;
    if (iVar5 < (int)uVar6) {
      pcVar3 = L"Precision exceeds length of byte array";
    }
    else {
      pcVar3 = L"Most significant digit is zero in byte mode";
      if ((0 < (int)uVar6) && (*(char *)(((this->fBCD).bcdLong - 1) + uVar7) != '\0')) {
        if (*(this->fBCD).bcdBytes.ptr == '\0') {
          pcVar3 = L"Least significant digit is zero in long mode";
        }
        else {
          pcVar2 = (this->fBCD).bcdBytes.ptr;
          pcVar3 = L"Digit exceeding 10 in byte array";
          bVar11 = true;
          if (*pcVar2 < '\n') {
            uVar10 = 1;
            while (-1 < pcVar2[uVar10 - 1]) {
              bVar11 = uVar10 < uVar7;
              if ((uVar10 == uVar7) ||
                 (pcVar1 = pcVar2 + uVar10, uVar10 = uVar10 + 1, '\t' < *pcVar1)) goto LAB_00228bc3;
            }
            pcVar3 = L"Digit below 0 in byte array";
          }
LAB_00228bc3:
          if (!bVar11) {
            bVar11 = true;
            if ((int)uVar6 < iVar5) {
              uVar10 = uVar7;
              do {
                if ((uVar10 < uVar7) && ((this->fBCD).bcdBytes.ptr[uVar10] != '\0')) {
                  bVar11 = false;
                  pcVar3 = L"Nonzero digits outside of range in byte array";
                  break;
                }
                uVar10 = uVar10 + 1;
              } while ((int)uVar10 < iVar5);
            }
            goto joined_r0x00228bba;
          }
        }
      }
    }
    bVar11 = false;
  }
  else {
    uVar10 = (this->fBCD).bcdLong;
    if (uVar10 != 0 && uVar6 == 0) {
      return L"Value in bcdLong even though precision is zero";
    }
    if (0x10 < (int)uVar6) {
      return L"Precision exceeds length of long";
    }
    if (uVar6 != 0) {
      if (0xf < uVar6 - 1) {
        return L"Most significant digit is zero in long mode";
      }
      if ((0xfL << ((char)uVar6 * '\x04' - 4U & 0x3f) & uVar10) == 0) {
        return L"Most significant digit is zero in long mode";
      }
      if (uVar6 != 0 && (uVar10 & 0xf) == 0) {
        return L"Least significant digit is zero in long mode";
      }
    }
    if (0 < (int)uVar6) {
      uVar9 = 0;
      do {
        if ((uVar9 < 0x10) && (9 < ((uint)(uVar10 >> ((char)uVar9 * '\x04' & 0x3fU)) & 0xe))) {
          return L"Digit exceeding 10 in long";
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar7);
    }
    bVar11 = uVar6 == 0x10;
    if (bVar11) {
      pcVar3 = L"Digit exceeding 10 in long";
    }
    else {
      uVar8 = 0xf;
      if (0xf < (int)uVar6) {
        uVar8 = uVar6;
      }
      if ((uVar6 < 0x10) && ((0xfL << ((char)uVar6 * '\x04' & 0x3fU) & uVar10) != 0)) {
        pcVar3 = L"Nonzero digits outside of range in long";
      }
      else {
        iVar5 = uVar6 * 4 + 4;
        pcVar3 = L"Digit exceeding 10 in long";
        do {
          uVar6 = (uint)uVar7;
          if (uVar8 == uVar6) goto LAB_00228baf;
          bVar4 = (byte)iVar5;
          uVar7 = (ulong)(uVar6 + 1);
          iVar5 = iVar5 + 4;
        } while ((0xf < uVar6 + 1) || ((0xfL << (bVar4 & 0x3f) & uVar10) == 0));
        pcVar3 = L"Nonzero digits outside of range in long";
LAB_00228baf:
        bVar11 = 0xe < (int)uVar6;
      }
    }
  }
joined_r0x00228bba:
  if (bVar11) {
    pcVar3 = (char16_t *)0x0;
  }
  return pcVar3;
}

Assistant:

const char16_t* DecimalQuantity::checkHealth() const {
    if (usingBytes) {
        if (precision == 0) { return u"Zero precision but we are in byte mode"; }
        int32_t capacity = fBCD.bcdBytes.len;
        if (precision > capacity) { return u"Precision exceeds length of byte array"; }
        if (getDigitPos(precision - 1) == 0) { return u"Most significant digit is zero in byte mode"; }
        if (getDigitPos(0) == 0) { return u"Least significant digit is zero in long mode"; }
        for (int i = 0; i < precision; i++) {
            if (getDigitPos(i) >= 10) { return u"Digit exceeding 10 in byte array"; }
            if (getDigitPos(i) < 0) { return u"Digit below 0 in byte array"; }
        }
        for (int i = precision; i < capacity; i++) {
            if (getDigitPos(i) != 0) { return u"Nonzero digits outside of range in byte array"; }
        }
    } else {
        if (precision == 0 && fBCD.bcdLong != 0) {
            return u"Value in bcdLong even though precision is zero";
        }
        if (precision > 16) { return u"Precision exceeds length of long"; }
        if (precision != 0 && getDigitPos(precision - 1) == 0) {
            return u"Most significant digit is zero in long mode";
        }
        if (precision != 0 && getDigitPos(0) == 0) {
            return u"Least significant digit is zero in long mode";
        }
        for (int i = 0; i < precision; i++) {
            if (getDigitPos(i) >= 10) { return u"Digit exceeding 10 in long"; }
            if (getDigitPos(i) < 0) { return u"Digit below 0 in long (?!)"; }
        }
        for (int i = precision; i < 16; i++) {
            if (getDigitPos(i) != 0) { return u"Nonzero digits outside of range in long"; }
        }
    }

    // No error
    return nullptr;
}